

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_refresh_registration_adds_a_refresh_control_to_sync_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_refresh_registration_adds_a_refresh_control_to_sync_Test
           *this)

{
  long lVar1;
  char *message_00;
  char *in_R9;
  AssertHelper local_1d0;
  AssertHelper local_1c8;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  AssertionResult gtest_ar;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  SubjectSetRegister subject_register;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_198,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_198,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  gtest_ar_.success_ =
       message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
       _M_payload.
       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
       .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged ==
      false) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x1f6f66,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x202,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_1b0,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_1b0,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_move_assign
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&message,
             (_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar);
  bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  local_1d0.data_._0_4_ = 0;
  lVar1 = bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  gtest_ar_._0_8_ = *(undefined8 *)(lVar1 + 0x28);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"0","message->GetControls().size()",(int *)&local_1d0,
             (unsigned_long *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x209,message_00);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&message);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_refresh_registration_adds_a_refresh_control_to_sync)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    EXPECT_TRUE(message);

    subject_register.Register(SS_SUBJECT1, true);
    message = subject_register.NextSubscriptionSync();

    auto actual_message = message->GetControls().begin();

    EXPECT_EQ(0, message->GetControls().size());
}